

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int __thiscall ncnn::Gemm::load_model(Gemm *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  void *local_718;
  int *local_710;
  long *local_6f8;
  void *local_6d0;
  int *local_6c8;
  undefined8 local_6c0;
  undefined4 local_6b8;
  long *local_6b0;
  undefined4 local_6a8;
  undefined4 local_6a4;
  undefined4 local_6a0;
  undefined4 local_69c;
  undefined4 local_698;
  undefined8 local_690;
  void *local_688;
  int *local_680;
  undefined8 local_678;
  undefined4 local_670;
  long *local_668;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 local_658;
  undefined4 local_654;
  undefined4 local_650;
  undefined8 local_648;
  void *local_640;
  int *local_638;
  undefined8 local_630;
  undefined4 local_628;
  long *local_620;
  undefined4 local_618;
  undefined4 local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  undefined8 local_600;
  void *local_5f8;
  int *local_5f0;
  undefined8 local_5e8;
  undefined4 local_5e0;
  long *local_5d8;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  undefined8 local_5b8;
  void *local_5b0;
  int *local_5a8;
  undefined8 local_5a0;
  undefined4 local_598;
  long *local_590;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined8 local_570;
  void *local_568;
  int *local_560;
  undefined8 local_558;
  undefined4 local_550;
  long *local_548;
  undefined4 local_540;
  undefined4 local_53c;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 local_530;
  undefined8 local_528;
  void *local_520;
  int *local_518;
  undefined8 local_510;
  undefined4 local_508;
  long *local_500;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined8 local_4e0;
  void *local_4c8;
  int *local_4c0;
  undefined8 local_4b8;
  undefined4 local_4b0;
  long *local_4a8;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined8 local_488;
  long *local_480;
  void **local_468;
  void **local_458;
  void **local_448;
  void **local_438;
  void **local_428;
  void **local_418;
  void **local_408;
  void **local_3f8;
  void **local_3e8;
  int local_3d8;
  undefined4 local_3d4;
  void **local_3d0;
  void **local_3c8;
  void **local_3c0;
  int local_3b8;
  undefined4 local_3b4;
  void **local_3b0;
  void **local_3a8;
  void **local_3a0;
  int local_398;
  undefined4 local_394;
  void **local_390;
  void **local_388;
  void **local_380;
  int local_378;
  undefined4 local_374;
  void **local_370;
  void **local_368;
  void **local_360;
  int local_358;
  undefined4 local_354;
  void **local_350;
  void **local_348;
  void **local_340;
  int local_338;
  undefined4 local_334;
  void **local_330;
  void **local_328;
  void **local_320;
  int local_318;
  undefined4 local_314;
  void **local_310;
  void **local_308;
  void **local_300;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  void **local_2e8;
  void **local_2e0;
  int local_2d8;
  undefined4 local_2d4;
  void **local_2d0;
  void **local_2c8;
  void **local_2c0;
  long *local_2b0;
  long *local_2a8;
  int local_2a0;
  undefined4 local_29c;
  void **local_298;
  int local_290;
  undefined4 local_28c;
  void **local_288;
  int local_280;
  undefined4 local_27c;
  void **local_278;
  int local_270;
  undefined4 local_26c;
  void **local_268;
  int local_260;
  undefined4 local_25c;
  void **local_258;
  int local_250;
  undefined4 local_24c;
  void **local_248;
  int local_240;
  undefined4 local_23c;
  void **local_238;
  int local_230;
  undefined4 local_22c;
  void **local_228;
  int local_220;
  undefined4 local_21c;
  void **local_218;
  int local_200;
  undefined4 local_1fc;
  void **local_1f8;
  int local_1e0;
  undefined4 local_1dc;
  void **local_1d8;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  int local_160;
  undefined4 local_15c;
  void **local_158;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  long *local_18;
  long *local_10;
  
  local_480 = in_RSI;
  if (*(int *)(in_RDI + 0xe0) == 1) {
    if (*(int *)(in_RDI + 0xd8) == 0) {
      (**(code **)(*in_RSI + 0x18))
                (&local_4c8,in_RSI,*(undefined4 *)(in_RDI + 0xf4),*(undefined4 *)(in_RDI + 0xec),0);
      ppvVar2 = (void **)(in_RDI + 0x118);
      local_2d0 = &local_4c8;
      local_2c8 = ppvVar2;
      if (ppvVar2 != local_2d0) {
        if (local_4c0 != (int *)0x0) {
          local_2d4 = 1;
          LOCK();
          local_2d8 = *local_4c0;
          *local_4c0 = *local_4c0 + 1;
          UNLOCK();
        }
        local_298 = ppvVar2;
        if (*(long *)(in_RDI + 0x120) != 0) {
          piVar1 = *(int **)(in_RDI + 0x120);
          local_29c = 0xffffffff;
          LOCK();
          local_2a0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_2a0 == 1) {
            if (*(long *)(in_RDI + 0x138) == 0) {
              local_20 = *ppvVar2;
              if (local_20 != (void *)0x0) {
                free(local_20);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x138) + 0x18))(*(long **)(in_RDI + 0x138),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x128) = 0;
        *(undefined4 *)(in_RDI + 0x130) = 0;
        *(undefined4 *)(in_RDI + 0x140) = 0;
        *(undefined4 *)(in_RDI + 0x144) = 0;
        *(undefined4 *)(in_RDI + 0x148) = 0;
        *(undefined4 *)(in_RDI + 0x14c) = 0;
        *(undefined4 *)(in_RDI + 0x150) = 0;
        *(undefined8 *)(in_RDI + 0x158) = 0;
        *(undefined8 *)(in_RDI + 0x120) = 0;
        *ppvVar2 = *local_2d0;
        *(void **)(in_RDI + 0x120) = local_2d0[1];
        *(void **)(in_RDI + 0x128) = local_2d0[2];
        *(undefined4 *)(in_RDI + 0x130) = *(undefined4 *)(local_2d0 + 3);
        *(void **)(in_RDI + 0x138) = local_2d0[4];
        *(undefined4 *)(in_RDI + 0x140) = *(undefined4 *)(local_2d0 + 5);
        *(undefined4 *)(in_RDI + 0x144) = *(undefined4 *)((long)local_2d0 + 0x2c);
        *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_2d0 + 6);
        *(undefined4 *)(in_RDI + 0x14c) = *(undefined4 *)((long)local_2d0 + 0x34);
        *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_2d0 + 7);
        *(void **)(in_RDI + 0x158) = local_2d0[8];
      }
      local_468 = &local_4c8;
      local_2c0 = ppvVar2;
      local_f8 = local_468;
      if (local_4c0 != (int *)0x0) {
        local_fc = 0xffffffff;
        LOCK();
        local_100 = *local_4c0;
        *local_4c0 = *local_4c0 + -1;
        UNLOCK();
        if (local_100 == 1) {
          if (local_4a8 == (long *)0x0) {
            if (local_4c8 != (void *)0x0) {
              free(local_4c8);
            }
          }
          else {
            (**(code **)(*local_4a8 + 0x18))(local_4a8,local_4c8);
          }
        }
      }
      local_4c8 = (void *)0x0;
      local_4b8 = 0;
      local_4b0 = 0;
      local_4a0 = 0;
      local_49c = 0;
      local_498 = 0;
      local_494 = 0;
      local_490 = 0;
      local_488 = 0;
      local_4c0 = (int *)0x0;
    }
    else {
      (**(code **)(*in_RSI + 0x18))
                (&local_520,in_RSI,*(undefined4 *)(in_RDI + 0xec),*(undefined4 *)(in_RDI + 0xf4),0);
      ppvVar2 = (void **)(in_RDI + 0x118);
      local_2f0 = &local_520;
      local_2e8 = ppvVar2;
      if (ppvVar2 != local_2f0) {
        if (local_518 != (int *)0x0) {
          local_2f4 = 1;
          LOCK();
          local_2f8 = *local_518;
          *local_518 = *local_518 + 1;
          UNLOCK();
        }
        local_288 = ppvVar2;
        if (*(long *)(in_RDI + 0x120) != 0) {
          piVar1 = *(int **)(in_RDI + 0x120);
          local_28c = 0xffffffff;
          LOCK();
          local_290 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_290 == 1) {
            if (*(long *)(in_RDI + 0x138) == 0) {
              local_28 = *ppvVar2;
              if (local_28 != (void *)0x0) {
                free(local_28);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x138) + 0x18))(*(long **)(in_RDI + 0x138),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x128) = 0;
        *(undefined4 *)(in_RDI + 0x130) = 0;
        *(undefined4 *)(in_RDI + 0x140) = 0;
        *(undefined4 *)(in_RDI + 0x144) = 0;
        *(undefined4 *)(in_RDI + 0x148) = 0;
        *(undefined4 *)(in_RDI + 0x14c) = 0;
        *(undefined4 *)(in_RDI + 0x150) = 0;
        *(undefined8 *)(in_RDI + 0x158) = 0;
        *(undefined8 *)(in_RDI + 0x120) = 0;
        *ppvVar2 = *local_2f0;
        *(void **)(in_RDI + 0x120) = local_2f0[1];
        *(void **)(in_RDI + 0x128) = local_2f0[2];
        *(undefined4 *)(in_RDI + 0x130) = *(undefined4 *)(local_2f0 + 3);
        *(void **)(in_RDI + 0x138) = local_2f0[4];
        *(undefined4 *)(in_RDI + 0x140) = *(undefined4 *)(local_2f0 + 5);
        *(undefined4 *)(in_RDI + 0x144) = *(undefined4 *)((long)local_2f0 + 0x2c);
        *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_2f0 + 6);
        *(undefined4 *)(in_RDI + 0x14c) = *(undefined4 *)((long)local_2f0 + 0x34);
        *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_2f0 + 7);
        *(void **)(in_RDI + 0x158) = local_2f0[8];
      }
      local_458 = &local_520;
      local_2e0 = ppvVar2;
      local_118 = local_458;
      if (local_518 != (int *)0x0) {
        local_11c = 0xffffffff;
        LOCK();
        local_120 = *local_518;
        *local_518 = *local_518 + -1;
        UNLOCK();
        if (local_120 == 1) {
          if (local_500 == (long *)0x0) {
            if (local_520 != (void *)0x0) {
              free(local_520);
            }
          }
          else {
            (**(code **)(*local_500 + 0x18))(local_500,local_520);
          }
        }
      }
      local_520 = (void *)0x0;
      local_510 = 0;
      local_508 = 0;
      local_4f8 = 0;
      local_4f4 = 0;
      local_4f0 = 0;
      local_4ec = 0;
      local_4e8 = 0;
      local_4e0 = 0;
      local_518 = (int *)0x0;
    }
    local_2a8 = (long *)(in_RDI + 0x118);
    bVar3 = true;
    if (*local_2a8 != 0) {
      bVar3 = *(long *)(in_RDI + 0x158) * (long)*(int *)(in_RDI + 0x150) == 0;
      local_18 = local_2a8;
    }
    if (bVar3) {
      return -100;
    }
  }
  if (*(int *)(in_RDI + 0xe4) == 1) {
    if (*(int *)(in_RDI + 0xdc) == 0) {
      (**(code **)(*local_480 + 0x18))
                (&local_568,local_480,*(undefined4 *)(in_RDI + 0xf0),*(undefined4 *)(in_RDI + 0xf4),
                 0);
      ppvVar2 = (void **)(in_RDI + 0x160);
      local_310 = &local_568;
      local_308 = ppvVar2;
      if (ppvVar2 != local_310) {
        if (local_560 != (int *)0x0) {
          local_314 = 1;
          LOCK();
          local_318 = *local_560;
          *local_560 = *local_560 + 1;
          UNLOCK();
        }
        local_278 = ppvVar2;
        if (*(long *)(in_RDI + 0x168) != 0) {
          piVar1 = *(int **)(in_RDI + 0x168);
          local_27c = 0xffffffff;
          LOCK();
          local_280 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_280 == 1) {
            if (*(long *)(in_RDI + 0x180) == 0) {
              local_30 = *ppvVar2;
              if (local_30 != (void *)0x0) {
                free(local_30);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x180) + 0x18))(*(long **)(in_RDI + 0x180),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x170) = 0;
        *(undefined4 *)(in_RDI + 0x178) = 0;
        *(undefined4 *)(in_RDI + 0x188) = 0;
        *(undefined4 *)(in_RDI + 0x18c) = 0;
        *(undefined4 *)(in_RDI + 400) = 0;
        *(undefined4 *)(in_RDI + 0x194) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined8 *)(in_RDI + 0x1a0) = 0;
        *(undefined8 *)(in_RDI + 0x168) = 0;
        *ppvVar2 = *local_310;
        *(void **)(in_RDI + 0x168) = local_310[1];
        *(void **)(in_RDI + 0x170) = local_310[2];
        *(undefined4 *)(in_RDI + 0x178) = *(undefined4 *)(local_310 + 3);
        *(void **)(in_RDI + 0x180) = local_310[4];
        *(undefined4 *)(in_RDI + 0x188) = *(undefined4 *)(local_310 + 5);
        *(undefined4 *)(in_RDI + 0x18c) = *(undefined4 *)((long)local_310 + 0x2c);
        *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_310 + 6);
        *(undefined4 *)(in_RDI + 0x194) = *(undefined4 *)((long)local_310 + 0x34);
        *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_310 + 7);
        *(void **)(in_RDI + 0x1a0) = local_310[8];
      }
      local_448 = &local_568;
      local_300 = ppvVar2;
      local_138 = local_448;
      if (local_560 != (int *)0x0) {
        local_13c = 0xffffffff;
        LOCK();
        local_140 = *local_560;
        *local_560 = *local_560 + -1;
        UNLOCK();
        if (local_140 == 1) {
          if (local_548 == (long *)0x0) {
            if (local_568 != (void *)0x0) {
              free(local_568);
            }
          }
          else {
            (**(code **)(*local_548 + 0x18))(local_548,local_568);
          }
        }
      }
      local_568 = (void *)0x0;
      local_558 = 0;
      local_550 = 0;
      local_540 = 0;
      local_53c = 0;
      local_538 = 0;
      local_534 = 0;
      local_530 = 0;
      local_528 = 0;
      local_560 = (int *)0x0;
    }
    else {
      (**(code **)(*local_480 + 0x18))
                (&local_5b0,local_480,*(undefined4 *)(in_RDI + 0xf4),*(undefined4 *)(in_RDI + 0xf0),
                 0);
      ppvVar2 = (void **)(in_RDI + 0x160);
      local_330 = &local_5b0;
      local_328 = ppvVar2;
      if (ppvVar2 != local_330) {
        if (local_5a8 != (int *)0x0) {
          local_334 = 1;
          LOCK();
          local_338 = *local_5a8;
          *local_5a8 = *local_5a8 + 1;
          UNLOCK();
        }
        local_268 = ppvVar2;
        if (*(long *)(in_RDI + 0x168) != 0) {
          piVar1 = *(int **)(in_RDI + 0x168);
          local_26c = 0xffffffff;
          LOCK();
          local_270 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_270 == 1) {
            if (*(long *)(in_RDI + 0x180) == 0) {
              local_38 = *ppvVar2;
              if (local_38 != (void *)0x0) {
                free(local_38);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x180) + 0x18))(*(long **)(in_RDI + 0x180),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x170) = 0;
        *(undefined4 *)(in_RDI + 0x178) = 0;
        *(undefined4 *)(in_RDI + 0x188) = 0;
        *(undefined4 *)(in_RDI + 0x18c) = 0;
        *(undefined4 *)(in_RDI + 400) = 0;
        *(undefined4 *)(in_RDI + 0x194) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined8 *)(in_RDI + 0x1a0) = 0;
        *(undefined8 *)(in_RDI + 0x168) = 0;
        *ppvVar2 = *local_330;
        *(void **)(in_RDI + 0x168) = local_330[1];
        *(void **)(in_RDI + 0x170) = local_330[2];
        *(undefined4 *)(in_RDI + 0x178) = *(undefined4 *)(local_330 + 3);
        *(void **)(in_RDI + 0x180) = local_330[4];
        *(undefined4 *)(in_RDI + 0x188) = *(undefined4 *)(local_330 + 5);
        *(undefined4 *)(in_RDI + 0x18c) = *(undefined4 *)((long)local_330 + 0x2c);
        *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_330 + 6);
        *(undefined4 *)(in_RDI + 0x194) = *(undefined4 *)((long)local_330 + 0x34);
        *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_330 + 7);
        *(void **)(in_RDI + 0x1a0) = local_330[8];
      }
      local_438 = &local_5b0;
      local_320 = ppvVar2;
      local_158 = local_438;
      if (local_5a8 != (int *)0x0) {
        local_15c = 0xffffffff;
        LOCK();
        local_160 = *local_5a8;
        *local_5a8 = *local_5a8 + -1;
        UNLOCK();
        if (local_160 == 1) {
          if (local_590 == (long *)0x0) {
            if (local_5b0 != (void *)0x0) {
              free(local_5b0);
            }
          }
          else {
            (**(code **)(*local_590 + 0x18))(local_590,local_5b0);
          }
        }
      }
      local_5b0 = (void *)0x0;
      local_5a0 = 0;
      local_598 = 0;
      local_588 = 0;
      local_584 = 0;
      local_580 = 0;
      local_57c = 0;
      local_578 = 0;
      local_570 = 0;
      local_5a8 = (int *)0x0;
    }
    local_2b0 = (long *)(in_RDI + 0x160);
    bVar3 = true;
    if (*local_2b0 != 0) {
      bVar3 = *(long *)(in_RDI + 0x1a0) * (long)*(int *)(in_RDI + 0x198) == 0;
      local_10 = local_2b0;
    }
    if (bVar3) {
      return -100;
    }
  }
  if ((*(int *)(in_RDI + 0xe8) == 1) && (*(int *)(in_RDI + 0xf8) != -1)) {
    if (*(int *)(in_RDI + 0xf8) == 0) {
      (**(code **)(*local_480 + 0x10))(&local_5f8,local_480,1,0);
      ppvVar2 = (void **)(in_RDI + 0x1a8);
      local_350 = &local_5f8;
      local_348 = ppvVar2;
      if (ppvVar2 != local_350) {
        if (local_5f0 != (int *)0x0) {
          local_354 = 1;
          LOCK();
          local_358 = *local_5f0;
          *local_5f0 = *local_5f0 + 1;
          UNLOCK();
        }
        local_258 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b0) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b0);
          local_25c = 0xffffffff;
          LOCK();
          local_260 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_260 == 1) {
            if (*(long *)(in_RDI + 0x1c8) == 0) {
              local_40 = *ppvVar2;
              if (local_40 != (void *)0x0) {
                free(local_40);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1c8) + 0x18))(*(long **)(in_RDI + 0x1c8),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *(undefined4 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1d0) = 0;
        *(undefined4 *)(in_RDI + 0x1d4) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined8 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1b0) = 0;
        *ppvVar2 = *local_350;
        *(void **)(in_RDI + 0x1b0) = local_350[1];
        *(void **)(in_RDI + 0x1b8) = local_350[2];
        *(undefined4 *)(in_RDI + 0x1c0) = *(undefined4 *)(local_350 + 3);
        *(void **)(in_RDI + 0x1c8) = local_350[4];
        *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_350 + 5);
        *(undefined4 *)(in_RDI + 0x1d4) = *(undefined4 *)((long)local_350 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_350 + 6);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_350 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_350 + 7);
        *(void **)(in_RDI + 0x1e8) = local_350[8];
      }
      local_428 = &local_5f8;
      local_340 = ppvVar2;
      local_178 = local_428;
      if (local_5f0 != (int *)0x0) {
        local_17c = 0xffffffff;
        LOCK();
        local_180 = *local_5f0;
        *local_5f0 = *local_5f0 + -1;
        UNLOCK();
        if (local_180 == 1) {
          if (local_5d8 == (long *)0x0) {
            if (local_5f8 != (void *)0x0) {
              free(local_5f8);
            }
          }
          else {
            (**(code **)(*local_5d8 + 0x18))(local_5d8,local_5f8);
          }
        }
      }
      local_5f8 = (void *)0x0;
      local_5e8 = 0;
      local_5e0 = 0;
      local_5d0 = 0;
      local_5cc = 0;
      local_5c8 = 0;
      local_5c4 = 0;
      local_5c0 = 0;
      local_5b8 = 0;
      local_5f0 = (int *)0x0;
    }
    if (*(int *)(in_RDI + 0xf8) == 1) {
      (**(code **)(*local_480 + 0x10))(&local_640,local_480,*(undefined4 *)(in_RDI + 0xec),0);
      ppvVar2 = (void **)(in_RDI + 0x1a8);
      local_370 = &local_640;
      local_368 = ppvVar2;
      if (ppvVar2 != local_370) {
        if (local_638 != (int *)0x0) {
          local_374 = 1;
          LOCK();
          local_378 = *local_638;
          *local_638 = *local_638 + 1;
          UNLOCK();
        }
        local_248 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b0) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b0);
          local_24c = 0xffffffff;
          LOCK();
          local_250 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_250 == 1) {
            if (*(long *)(in_RDI + 0x1c8) == 0) {
              local_48 = *ppvVar2;
              if (local_48 != (void *)0x0) {
                free(local_48);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1c8) + 0x18))(*(long **)(in_RDI + 0x1c8),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *(undefined4 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1d0) = 0;
        *(undefined4 *)(in_RDI + 0x1d4) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined8 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1b0) = 0;
        *ppvVar2 = *local_370;
        *(void **)(in_RDI + 0x1b0) = local_370[1];
        *(void **)(in_RDI + 0x1b8) = local_370[2];
        *(undefined4 *)(in_RDI + 0x1c0) = *(undefined4 *)(local_370 + 3);
        *(void **)(in_RDI + 0x1c8) = local_370[4];
        *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_370 + 5);
        *(undefined4 *)(in_RDI + 0x1d4) = *(undefined4 *)((long)local_370 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_370 + 6);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_370 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_370 + 7);
        *(void **)(in_RDI + 0x1e8) = local_370[8];
      }
      local_418 = &local_640;
      local_360 = ppvVar2;
      local_198 = local_418;
      if (local_638 != (int *)0x0) {
        local_19c = 0xffffffff;
        LOCK();
        local_1a0 = *local_638;
        *local_638 = *local_638 + -1;
        UNLOCK();
        if (local_1a0 == 1) {
          if (local_620 == (long *)0x0) {
            if (local_640 != (void *)0x0) {
              free(local_640);
            }
          }
          else {
            (**(code **)(*local_620 + 0x18))(local_620,local_640);
          }
        }
      }
      local_640 = (void *)0x0;
      local_630 = 0;
      local_628 = 0;
      local_618 = 0;
      local_614 = 0;
      local_610 = 0;
      local_60c = 0;
      local_608 = 0;
      local_600 = 0;
      local_638 = (int *)0x0;
    }
    if (*(int *)(in_RDI + 0xf8) == 2) {
      (**(code **)(*local_480 + 0x18))(&local_688,local_480,1,*(undefined4 *)(in_RDI + 0xec),0);
      ppvVar2 = (void **)(in_RDI + 0x1a8);
      local_390 = &local_688;
      local_388 = ppvVar2;
      if (ppvVar2 != local_390) {
        if (local_680 != (int *)0x0) {
          local_394 = 1;
          LOCK();
          local_398 = *local_680;
          *local_680 = *local_680 + 1;
          UNLOCK();
        }
        local_238 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b0) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b0);
          local_23c = 0xffffffff;
          LOCK();
          local_240 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_240 == 1) {
            if (*(long *)(in_RDI + 0x1c8) == 0) {
              local_50 = *ppvVar2;
              if (local_50 != (void *)0x0) {
                free(local_50);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1c8) + 0x18))(*(long **)(in_RDI + 0x1c8),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *(undefined4 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1d0) = 0;
        *(undefined4 *)(in_RDI + 0x1d4) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined8 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1b0) = 0;
        *ppvVar2 = *local_390;
        *(void **)(in_RDI + 0x1b0) = local_390[1];
        *(void **)(in_RDI + 0x1b8) = local_390[2];
        *(undefined4 *)(in_RDI + 0x1c0) = *(undefined4 *)(local_390 + 3);
        *(void **)(in_RDI + 0x1c8) = local_390[4];
        *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_390 + 5);
        *(undefined4 *)(in_RDI + 0x1d4) = *(undefined4 *)((long)local_390 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_390 + 6);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_390 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_390 + 7);
        *(void **)(in_RDI + 0x1e8) = local_390[8];
      }
      local_408 = &local_688;
      local_380 = ppvVar2;
      local_1b8 = local_408;
      if (local_680 != (int *)0x0) {
        local_1bc = 0xffffffff;
        LOCK();
        local_1c0 = *local_680;
        *local_680 = *local_680 + -1;
        UNLOCK();
        if (local_1c0 == 1) {
          if (local_668 == (long *)0x0) {
            if (local_688 != (void *)0x0) {
              free(local_688);
            }
          }
          else {
            (**(code **)(*local_668 + 0x18))(local_668,local_688);
          }
        }
      }
      local_688 = (void *)0x0;
      local_678 = 0;
      local_670 = 0;
      local_660 = 0;
      local_65c = 0;
      local_658 = 0;
      local_654 = 0;
      local_650 = 0;
      local_648 = 0;
      local_680 = (int *)0x0;
    }
    if (*(int *)(in_RDI + 0xf8) == 3) {
      (**(code **)(*local_480 + 0x18))
                (&local_6d0,local_480,*(undefined4 *)(in_RDI + 0xf0),*(undefined4 *)(in_RDI + 0xec),
                 0);
      ppvVar2 = (void **)(in_RDI + 0x1a8);
      local_3b0 = &local_6d0;
      local_3a8 = ppvVar2;
      if (ppvVar2 != local_3b0) {
        if (local_6c8 != (int *)0x0) {
          local_3b4 = 1;
          LOCK();
          local_3b8 = *local_6c8;
          *local_6c8 = *local_6c8 + 1;
          UNLOCK();
        }
        local_228 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b0) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b0);
          local_22c = 0xffffffff;
          LOCK();
          local_230 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_230 == 1) {
            if (*(long *)(in_RDI + 0x1c8) == 0) {
              local_58 = *ppvVar2;
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1c8) + 0x18))(*(long **)(in_RDI + 0x1c8),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *(undefined4 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1d0) = 0;
        *(undefined4 *)(in_RDI + 0x1d4) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined8 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1b0) = 0;
        *ppvVar2 = *local_3b0;
        *(void **)(in_RDI + 0x1b0) = local_3b0[1];
        *(void **)(in_RDI + 0x1b8) = local_3b0[2];
        *(undefined4 *)(in_RDI + 0x1c0) = *(undefined4 *)(local_3b0 + 3);
        *(void **)(in_RDI + 0x1c8) = local_3b0[4];
        *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_3b0 + 5);
        *(undefined4 *)(in_RDI + 0x1d4) = *(undefined4 *)((long)local_3b0 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_3b0 + 6);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_3b0 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_3b0 + 7);
        *(void **)(in_RDI + 0x1e8) = local_3b0[8];
      }
      local_3f8 = &local_6d0;
      local_3a0 = ppvVar2;
      local_1d8 = local_3f8;
      if (local_6c8 != (int *)0x0) {
        local_1dc = 0xffffffff;
        LOCK();
        local_1e0 = *local_6c8;
        *local_6c8 = *local_6c8 + -1;
        UNLOCK();
        if (local_1e0 == 1) {
          if (local_6b0 == (long *)0x0) {
            if (local_6d0 != (void *)0x0) {
              free(local_6d0);
            }
          }
          else {
            (**(code **)(*local_6b0 + 0x18))(local_6b0,local_6d0);
          }
        }
      }
      local_6d0 = (void *)0x0;
      local_6c0 = 0;
      local_6b8 = 0;
      local_6a8 = 0;
      local_6a4 = 0;
      local_6a0 = 0;
      local_69c = 0;
      local_698 = 0;
      local_690 = 0;
      local_6c8 = (int *)0x0;
    }
    if (*(int *)(in_RDI + 0xf8) == 4) {
      (**(code **)(*local_480 + 0x18))(&local_718,local_480,*(undefined4 *)(in_RDI + 0xf0),1,0);
      ppvVar2 = (void **)(in_RDI + 0x1a8);
      local_3d0 = &local_718;
      local_3c8 = ppvVar2;
      if (ppvVar2 != local_3d0) {
        if (local_710 != (int *)0x0) {
          local_3d4 = 1;
          LOCK();
          local_3d8 = *local_710;
          *local_710 = *local_710 + 1;
          UNLOCK();
        }
        local_218 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b0) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b0);
          local_21c = 0xffffffff;
          LOCK();
          local_220 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_220 == 1) {
            if (*(long *)(in_RDI + 0x1c8) == 0) {
              local_60 = *ppvVar2;
              if (local_60 != (void *)0x0) {
                free(local_60);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1c8) + 0x18))(*(long **)(in_RDI + 0x1c8),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *(undefined4 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1d0) = 0;
        *(undefined4 *)(in_RDI + 0x1d4) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined8 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1b0) = 0;
        *ppvVar2 = *local_3d0;
        *(void **)(in_RDI + 0x1b0) = local_3d0[1];
        *(void **)(in_RDI + 0x1b8) = local_3d0[2];
        *(undefined4 *)(in_RDI + 0x1c0) = *(undefined4 *)(local_3d0 + 3);
        *(void **)(in_RDI + 0x1c8) = local_3d0[4];
        *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_3d0 + 5);
        *(undefined4 *)(in_RDI + 0x1d4) = *(undefined4 *)((long)local_3d0 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_3d0 + 6);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_3d0 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_3d0 + 7);
        *(void **)(in_RDI + 0x1e8) = local_3d0[8];
      }
      local_3e8 = &local_718;
      if (local_710 != (int *)0x0) {
        local_1fc = 0xffffffff;
        LOCK();
        local_200 = *local_710;
        *local_710 = *local_710 + -1;
        UNLOCK();
        if (local_200 == 1) {
          local_3c0 = ppvVar2;
          local_1f8 = local_3e8;
          if (local_6f8 == (long *)0x0) {
            if (local_718 != (void *)0x0) {
              free(local_718);
            }
          }
          else {
            (**(code **)(*local_6f8 + 0x18))(local_6f8,local_718);
          }
        }
      }
    }
    bVar3 = true;
    if (*(long *)(in_RDI + 0x1a8) != 0) {
      bVar3 = *(long *)(in_RDI + 0x1e8) * (long)*(int *)(in_RDI + 0x1e0) == 0;
    }
    if (bVar3) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Gemm::load_model(const ModelBin& mb)
{
    if (constantA == 1)
    {
        if (transA == 0)
            A_data = mb.load(constantK, constantM, 0);
        else
            A_data = mb.load(constantM, constantK, 0);
        if (A_data.empty())
            return -100;
    }

    if (constantB == 1)
    {
        if (transB == 0)
            B_data = mb.load(constantN, constantK, 0);
        else
            B_data = mb.load(constantK, constantN, 0);
        if (B_data.empty())
            return -100;
    }

    if (constantC == 1 && constant_broadcast_type_C != -1)
    {
        if (constant_broadcast_type_C == 0)
            C_data = mb.load(1, 0);
        if (constant_broadcast_type_C == 1)
            C_data = mb.load(constantM, 0);
        if (constant_broadcast_type_C == 2)
            C_data = mb.load(1, constantM, 0);
        if (constant_broadcast_type_C == 3)
            C_data = mb.load(constantN, constantM, 0);
        if (constant_broadcast_type_C == 4)
            C_data = mb.load(constantN, 1, 0);
        if (C_data.empty())
            return -100;
    }

    return 0;
}